

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ResultBuilder * __thiscall
Catch::ExpressionLhs<float_const&>::
captureExpression<(Catch::Internal::Operator)0,Catch::Detail::Approx>
          (ExpressionLhs<float_const&> *this,Approx *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  Catch *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  string local_78;
  string local_58;
  string local_38;
  
  dVar2 = (double)**(float **)(this + 8);
  dVar3 = (double)CONCAT44((uint)((ulong)dVar2 >> 0x20) & DAT_00184670._4_4_,
                           SUB84(dVar2,0) & (uint)DAT_00184670);
  dVar4 = (double)((ulong)rhs->m_value & (ulong)DAT_00184670);
  if (dVar4 <= dVar3) {
    dVar4 = dVar3;
  }
  result = (double)((ulong)(dVar2 - rhs->m_value) & (ulong)DAT_00184670) <
           (dVar4 + rhs->m_scale) * rhs->m_epsilon;
  this_00 = (Catch *)(ulong)result;
  pRVar1 = ResultBuilder::setResultType(*(ResultBuilder **)this,result);
  Catch::toString_abi_cxx11_(&local_38,this_00,**(float **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::Approx::toString_abi_cxx11_(&local_58,rhs);
  pRVar1 = ResultBuilder::setRhs(pRVar1,(string *)&local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }